

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void DoIt(bool allIntensityBinsCheck)

{
  ValidateVulnerability vV;
  ValidateVulnerability local_30c8;
  
  local_30c8.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_30c8.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_30c8.super_Validate.lineno_ = 1;
  local_30c8.super_Validate.warnings_ = false;
  local_30c8.super_Validate.MIN_ID_ = 1;
  local_30c8._vptr_ValidateVulnerability = (_func_int **)&PTR_WriteBinVulnerabilityFile_00106d60;
  local_30c8.convertToBin_ = false;
  local_30c8.useIndexFile_ = false;
  local_30c8.prevVulID_ = 0;
  builtin_strncpy(local_30c8.vulIDName_,"Vulnerability",0xe);
  local_30c8.prevDamageBinID_ = 0;
  local_30c8.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_30c8.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_30c8.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_30c8.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_30c8.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_30c8.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_30c8.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_30c8.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  builtin_strncpy(local_30c8.super_Validate.fileDescription_ + 8,"ility",6);
  builtin_strncpy(local_30c8.super_Validate.fileDescription_,"Vulnerab",8);
  local_30c8.allIntensityBinsCheck_ = allIntensityBinsCheck;
  local_30c8.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_30c8.intensityBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_30c8.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_30c8.vulIDToIntBinIDs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Validate::SkipHeaderRow(&local_30c8.super_Validate);
  ValidateVulnerability::ReadVulnerabilityFile(&local_30c8);
  ValidateVulnerability::PrintMaximumDamageBinIndex(&local_30c8);
  Validate::PrintSuccessMessage(&local_30c8.super_Validate);
  local_30c8._vptr_ValidateVulnerability = (_func_int **)&PTR_WriteBinVulnerabilityFile_00106d60;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_30c8.vulIDToIntBinIDs_._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_30c8.intensityBinIDs_._M_t);
  return;
}

Assistant:

void DoIt(const bool allIntensityBinsCheck) {

  ValidateVulnerability vV(allIntensityBinsCheck);
  vV.SkipHeaderRow();
  vV.ReadVulnerabilityFile();
  vV.PrintMaximumDamageBinIndex();
  vV.PrintSuccessMessage();

}